

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split.cpp
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* tlx::split(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *into,char sep,string *str,size_type limit)

{
  char *pcVar1;
  size_type sVar2;
  const_iterator last;
  const_iterator it;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(into,(into->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start);
  if (limit != 0) {
    pcVar1 = (str->_M_dataplus)._M_p;
    sVar2 = str->_M_string_length;
    local_48._M_current = pcVar1;
    local_40._M_current = pcVar1;
    if (sVar2 != 0) {
      local_38._M_current = pcVar1 + sVar2;
      do {
        if (*local_40._M_current == sep) {
          if (limit <= ((long)(into->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(into->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start >> 5) + 1U) {
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)into,
                       &local_48,&local_38);
            return into;
          }
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)into,
                     &local_48,&local_40);
          local_48._M_current = local_40._M_current + 1;
          pcVar1 = (str->_M_dataplus)._M_p;
          sVar2 = str->_M_string_length;
        }
        local_40._M_current = local_40._M_current + 1;
        local_38._M_current = pcVar1 + sVar2;
      } while (local_40._M_current != local_38._M_current);
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)into,&local_48,
               &local_40);
  }
  return into;
}

Assistant:

std::vector<std::string>& split(
    std::vector<std::string>* into,
    char sep, const std::string& str, std::string::size_type limit) {

    into->clear();
    if (limit == 0) return *into;

    std::string::const_iterator it = str.begin(), last = it;

    for ( ; it != str.end(); ++it)
    {
        if (*it == sep)
        {
            if (into->size() + 1 >= limit)
            {
                into->emplace_back(last, str.end());
                return *into;
            }

            into->emplace_back(last, it);
            last = it + 1;
        }
    }

    into->emplace_back(last, it);

    return *into;
}